

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::perl_namespace_dirs
          (t_perl_generator *this,t_program *p,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  long lVar1;
  string ns;
  string local_70;
  value_type local_50;
  
  std::__cxx11::string::string((string *)&local_70,"perl",(allocator *)&local_50);
  t_program::get_namespace(&ns,p,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (ns._M_string_length != 0) {
    while( true ) {
      lVar1 = std::__cxx11::string::find((char *)&ns,0x2fd4e8);
      if (lVar1 == -1) break;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&ns);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(dirs,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&ns);
      std::__cxx11::string::operator=((string *)&ns,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (ns._M_string_length != 0) {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(dirs,&ns);
    }
  }
  std::__cxx11::string::~string((string *)&ns);
  return;
}

Assistant:

void perl_namespace_dirs(t_program* p, std::list<std::string>& dirs) {
    std::string ns = p->get_namespace("perl");
    std::string::size_type loc;

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        dirs.push_back(ns.substr(0, loc));
        ns = ns.substr(loc + 1);
      }
    }

    if (ns.size() > 0) {
      dirs.push_back(ns);
    }
  }